

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void CreateDefaultClassConstructor
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  uint uVar1;
  TypeClass *classType;
  ScopeData *pSVar2;
  Allocator *allocator;
  TypeBase *pTVar3;
  ExprBase **ppEVar4;
  FunctionData **ppFVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var;
  FunctionData *this;
  TypeFunction *pTVar9;
  TypeRef *contextType;
  SynBase *pSVar10;
  ExprVariableDefinition *pEVar11;
  ExprBase *pEVar12;
  _func_int **pp_Var13;
  VariableData *context;
  ExprVariableDefinition *pEVar14;
  undefined4 extraout_var_03;
  char *pcVar15;
  TypeBase *pTVar16;
  MemberHandle *pMVar17;
  InplaceStr IVar18;
  ArrayView<ArgumentData> arguments_00;
  IntrusiveList<ExprBase> expressions;
  SmallArray<ArgumentData,_32U> arguments;
  IntrusiveList<ExprBase> local_678;
  undefined8 local_668;
  undefined8 uStack_660;
  ExprBase *local_658;
  ExprBase *pEStack_650;
  SmallArray<ArgumentData,_32U> local_648;
  SynIdentifier *name;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  classType = classDefinition->classType;
  if (classType->extendable == false) {
    pMVar17 = (classType->super_TypeStruct).members.head;
    if (pMVar17 == (MemberHandle *)0x0) {
      return;
    }
    do {
      for (pTVar16 = pMVar17->variable->type; pTVar16 != (TypeBase *)0x0;
          pTVar16 = (TypeBase *)pTVar16[1]._vptr_TypeBase) {
        if (pTVar16->typeID != 0x13) goto LAB_001f821e;
      }
      pTVar16 = (TypeBase *)0x0;
LAB_001f821e:
      if ((pMVar17->initializer != (SynBase *)0x0) ||
         (bVar6 = HasDefaultConstructor(ctx,source,pTVar16), bVar6)) goto LAB_001f7d90;
      pMVar17 = pMVar17->next;
    } while (pMVar17 != (MemberHandle *)0x0);
    if (!bVar6) {
      return;
    }
  }
LAB_001f7d90:
  bVar6 = RestoreParentTypeScope(ctx,source,(TypeBase *)classType);
  pSVar2 = ctx->scope;
  IVar18 = GetTypeDefaultConstructorName(ctx,classType);
  IVar18 = GetFunctionNameInScope(ctx,pSVar2,(TypeBase *)classType,IVar18,false,false);
  local_648.allocator = ctx->allocator;
  lVar8 = 0x20;
  do {
    *(undefined8 *)((long)&local_658 + lVar8) = 0;
    *(undefined1 *)((long)&pEStack_650 + lVar8) = 0;
    *(undefined8 *)((long)local_648.little + lVar8 + -0x10) = 0;
    *(undefined8 *)((long)local_648.little + lVar8 + -8) = 0;
    *(undefined8 *)((long)&local_648.little[0].source + lVar8) = 0;
    *(undefined8 *)(&local_648.little[0].isExplicit + lVar8) = 0;
    lVar8 = lVar8 + 0x30;
  } while (lVar8 != 0x620);
  local_648.data = local_648.little;
  local_648.count = 0;
  local_648.max = 0x20;
  iVar7 = (*(local_648.allocator)->_vptr_Allocator[2])(local_648.allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var,iVar7);
  (name->super_SynBase).typeID = 4;
  (name->super_SynBase).begin = (Lexeme *)0x0;
  (name->super_SynBase).end = (Lexeme *)0x0;
  (name->super_SynBase).pos.begin = (char *)0x0;
  (name->super_SynBase).pos.end = (char *)0x0;
  *(undefined8 *)((long)&(name->super_SynBase).pos.end + 2) = 0;
  *(undefined8 *)((long)&(name->super_SynBase).next + 2) = 0;
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
  name->name = IVar18;
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  this = (FunctionData *)CONCAT44(extraout_var_00,iVar7);
  allocator = ctx->allocator;
  pSVar2 = ctx->scope;
  arguments_00.count = local_648.count;
  arguments_00.data = local_648.data;
  arguments_00._12_4_ = 0;
  pTVar9 = ExpressionContext::GetFunctionType(ctx,source,ctx->typeVoid,arguments_00);
  contextType = ExpressionContext::GetReferenceType(ctx,(TypeBase *)classType);
  local_668 = 0;
  uStack_660 = 0;
  uVar1 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar1 + 1;
  pcVar15 = (char *)0x0;
  FunctionData::FunctionData
            (this,allocator,source,pSVar2,false,false,false,pTVar9,&contextType->super_TypeBase,name
             ,(IntrusiveList<MatchData>)ZEXT816(0),uVar1);
  IVar18.end = pcVar15;
  IVar18.begin = (this->name->name).end;
  anon_unknown.dwarf_1117a3::CheckFunctionConflict
            ((anon_unknown_dwarf_1117a3 *)ctx,(ExpressionContext *)source,
             (SynBase *)(this->name->name).begin,IVar18);
  ExpressionContext::AddFunction(ctx,this);
  ExpressionContext::PushScope(ctx,this);
  this->functionScope = ctx->scope;
  pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pEVar11 = CreateFunctionContextArgument(ctx,pSVar10,this);
  this->argumentsSize = this->functionScope->dataSize;
  local_678.head = (ExprBase *)0x0;
  local_678.tail = (ExprBase *)0x0;
  CreateDefaultConstructorCode(ctx,source,classType,&local_678);
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  pEVar12 = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
  pTVar16 = ctx->typeVoid;
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
  pp_Var13 = (_func_int **)CONCAT44(extraout_var_02,iVar7);
  pTVar3 = ctx->typeVoid;
  *(undefined4 *)(pp_Var13 + 1) = 2;
  pp_Var13[2] = (_func_int *)source;
  pp_Var13[3] = (_func_int *)pTVar3;
  pp_Var13[4] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var13 + 5) = 0;
  *pp_Var13 = (_func_int *)&PTR__ExprBase_003e6b38;
  pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
  pSVar10 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar10,this,ctx->scope);
  pEVar12->typeID = 0x1c;
  pEVar12->source = source;
  pEVar12->type = pTVar16;
  pEVar12->next = (ExprBase *)0x0;
  pEVar12->listed = false;
  pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6668;
  pEVar12[1]._vptr_ExprBase = pp_Var13;
  *(undefined8 *)&pEVar12[1].typeID = 0;
  pEVar12[1].source = pSVar10;
  IntrusiveList<ExprBase>::push_back(&local_678,pEVar12);
  ClosePendingUpvalues(ctx,this);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION,true);
  if (bVar6) {
    ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  }
  context = CreateFunctionContextVariable(ctx,source,this,(FunctionData *)0x0);
  pEVar14 = CreateFunctionContextVariableDefinition(ctx,source,this,(FunctionData *)0x0,context);
  iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
  pEVar12 = (ExprBase *)CONCAT44(extraout_var_03,iVar7);
  pTVar9 = this->type;
  local_658 = local_678.head;
  pEStack_650 = local_678.tail;
  pEVar12->typeID = 0x24;
  pEVar12->source = source;
  pEVar12->type = &pTVar9->super_TypeBase;
  pEVar12->next = (ExprBase *)0x0;
  pEVar12->listed = false;
  pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e66a0;
  pEVar12[1]._vptr_ExprBase = (_func_int **)this;
  *(ExprVariableDefinition **)&pEVar12[1].typeID = pEVar11;
  pEVar12[1].source = (SynBase *)0x0;
  pEVar12[1].type = (TypeBase *)0x0;
  pEVar12[1].next = (ExprBase *)0x0;
  *(ExprBase **)&pEVar12[1].listed = local_678.head;
  pEVar12[2]._vptr_ExprBase = (_func_int **)local_678.tail;
  *(ExprVariableDefinition **)&pEVar12[2].typeID = pEVar14;
  pEVar12[2].source = (SynBase *)context;
  this->declaration = pEVar12;
  uVar1 = (ctx->definitions).count;
  if (uVar1 == (ctx->definitions).max) {
    SmallArray<ExprBase_*,_128U>::grow(&ctx->definitions,uVar1);
  }
  ppEVar4 = (ctx->definitions).data;
  if (ppEVar4 == (ExprBase **)0x0) {
    pcVar15 = "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]";
  }
  else {
    pEVar12 = this->declaration;
    uVar1 = (ctx->definitions).count;
    (ctx->definitions).count = uVar1 + 1;
    ppEVar4[uVar1] = pEVar12;
    IntrusiveList<ExprBase>::push_back(&classDefinition->functions,pEVar12);
    uVar1 = (classType->methods).count;
    if (uVar1 == (classType->methods).max) {
      SmallArray<FunctionData_*,_4U>::grow(&classType->methods,uVar1);
    }
    ppFVar5 = (classType->methods).data;
    if (ppFVar5 != (FunctionData **)0x0) {
      uVar1 = (classType->methods).count;
      (classType->methods).count = uVar1 + 1;
      ppFVar5[uVar1] = this;
      SmallArray<ArgumentData,_32U>::~SmallArray(&local_648);
      return;
    }
    pcVar15 = "void SmallArray<FunctionData *, 4>::push_back(const T &) [T = FunctionData *, N = 4]"
    ;
  }
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,pcVar15);
}

Assistant:

void CreateDefaultClassConstructor(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	TypeClass *classType = classDefinition->classType;

	// Check if custom default assignment operator is required
	bool customConstructor = false;

	if(classType->extendable)
	{
		customConstructor = true;
	}
	else
	{
		for(MemberHandle *el = classType->members.head; el; el = el->next)
		{
			TypeBase *base = el->variable->type;

			// Find array element type
			while(TypeArray *arrType = getType<TypeArray>(base))
				base = arrType->subType;

			if(el->initializer)
			{
				customConstructor = true;
				break;
			}

			if(HasDefaultConstructor(ctx, source, base))
			{
				customConstructor = true;
				break;
			}
		}
	}

	if(customConstructor)
	{
		bool addedParentScope = RestoreParentTypeScope(ctx, source, classType);

		InplaceStr functionName = GetFunctionNameInScope(ctx, ctx.scope, classType, GetTypeDefaultConstructorName(ctx, classType), false, false);

		SmallArray<ArgumentData, 32> arguments(ctx.allocator);

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(classType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		CreateDefaultConstructorCode(ctx, source, classType, expressions);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(source), function, ctx.scope)));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		if(addedParentScope)
			ctx.PopScope(SCOPE_TYPE);

		VariableData *contextVariable = CreateFunctionContextVariable(ctx, source, function, NULL);
		ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, source, function, NULL, contextVariable);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), NULL, expressions, contextVariableDefinition, contextVariable);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);

		classType->methods.push_back(function);
	}
}